

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O3

void sinf_norm_error(int nrhs,SuperMatrix *X,float *xtrue)

{
  float fVar1;
  int *piVar2;
  long lVar3;
  undefined1 auVar4 [16];
  long lVar5;
  int iVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  if (0 < nrhs) {
    piVar2 = (int *)X->Store;
    lVar3 = *(long *)(piVar2 + 2);
    iVar6 = 0;
    do {
      dVar7 = NAN;
      if (0 < (long)X->nrow) {
        auVar8 = ZEXT816(0);
        lVar5 = 0;
        do {
          fVar1 = *(float *)((long)(*piVar2 * iVar6) * 4 + lVar3 + lVar5 * 4);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = CONCAT44(fVar1,fVar1 - xtrue[lVar5]) & 0x7fffffff7fffffff;
          auVar8 = maxps(auVar8,auVar4);
          lVar5 = lVar5 + 1;
        } while (X->nrow != lVar5);
        dVar7 = (double)(auVar8._0_4_ / auVar8._4_4_);
      }
      printf("||X - Xtrue||/||X|| = %e\n",dVar7);
      iVar6 = iVar6 + 1;
    } while (iVar6 != nrhs);
  }
  return;
}

Assistant:

void sinf_norm_error(int nrhs, SuperMatrix *X, float *xtrue)
{
    DNformat *Xstore;
    float err, xnorm;
    float *Xmat, *soln_work;
    int i, j;

    Xstore = X->Store;
    Xmat = Xstore->nzval;

    for (j = 0; j < nrhs; j++) {
      soln_work = &Xmat[j*Xstore->lda];
      err = xnorm = 0.0;
      for (i = 0; i < X->nrow; i++) {
	err = SUPERLU_MAX(err, fabs(soln_work[i] - xtrue[i]));
	xnorm = SUPERLU_MAX(xnorm, fabs(soln_work[i]));
      }
      err = err / xnorm;
      printf("||X - Xtrue||/||X|| = %e\n", err);
    }
}